

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_clause_rewriter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InClauseRewriter::VisitReplace
          (InClauseRewriter *this,BoundOperatorExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  char cVar1;
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  long *plVar3;
  _func_int **pp_Var4;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var5;
  pointer pCVar6;
  idx_t iVar7;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar8;
  bool bVar9;
  int iVar10;
  reference pvVar11;
  pointer pEVar12;
  ulong uVar13;
  reference args_2;
  pointer pCVar14;
  type expr_00;
  pointer pBVar15;
  pointer pLVar16;
  LogicalOperator *pLVar17;
  LogicalFilter *pLVar18;
  pointer pLVar19;
  reference pvVar20;
  pointer pBVar21;
  long lVar22;
  idx_t i;
  ulong uVar23;
  byte bVar24;
  size_type *this_02;
  initializer_list<duckdb::LogicalType> __l;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_1a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a0;
  BoundOperatorExpression *local_198;
  templated_unique_single_t collection;
  vector<duckdb::ColumnBinding,_true> child_bindings;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_170;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_168;
  LogicalOperator *local_160;
  idx_t chunk_index;
  vector<duckdb::LogicalType,_true> types;
  DataChunk chunk;
  JoinCondition cond;
  LogicalType in_type;
  ColumnDataAppendState append_state;
  LogicalType local_48;
  
  local_1a0._M_head_impl = (Expression *)this;
  if ((byte)(*(char *)&expr_ptr[1].
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl - 0x23U) < 2
     ) {
    this_00 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *)(expr_ptr + 0xb);
    local_198 = expr;
    pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(this_00,0);
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar11);
    LogicalType::LogicalType(&in_type,&pEVar12->return_type);
    cVar1 = *(char *)&expr_ptr[1].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar24 = 1;
    uVar23 = 1;
    while( true ) {
      lVar22 = (long)expr_ptr[0xc].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
               (long)expr_ptr[0xb].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      uVar13 = lVar22 >> 3;
      if (uVar13 <= uVar23) break;
      pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(this_00,uVar23);
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar11);
      iVar10 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar12);
      bVar24 = bVar24 & (byte)iVar10;
      uVar23 = uVar23 + 1;
    }
    if (lVar22 == 0x10) {
      chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(chunk.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,'\x1a' - (cVar1 == '#'))
      ;
      pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(this_00,0);
      args_2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,1);
      make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&append_state,(ExpressionType *)&chunk,pvVar11,args_2);
    }
    else {
      if ((5 < uVar13 & bVar24) != 0) {
        LogicalType::LogicalType((LogicalType *)&append_state,&in_type);
        uVar23 = 1;
        __l._M_len = 1;
        __l._M_array = (iterator)&append_state;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   __l,(allocator_type *)&chunk);
        LogicalType::~LogicalType((LogicalType *)&append_state);
        make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
                  ((duckdb *)&collection,
                   *(ClientContext **)&(local_198->super_Expression).super_BaseExpression.type,
                   &types);
        append_state.current_chunk_state.handles._M_h._M_buckets =
             &append_state.current_chunk_state.handles._M_h._M_single_bucket;
        append_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
        append_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)0x0;
        append_state.current_chunk_state.handles._M_h._M_element_count = 0;
        append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
        append_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
        append_state.current_chunk_state.properties = INVALID;
        append_state.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        append_state.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        append_state.vector_data.
        super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
        super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pCVar14 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->(&collection);
        ColumnDataCollection::InitializeAppend(pCVar14,&append_state);
        DataChunk::DataChunk(&chunk);
        DataChunk::Initialize
                  (&chunk,*(ClientContext **)
                           &(local_198->super_Expression).super_BaseExpression.type,&types,0x800);
LAB_0059f698:
        if (uVar23 < (ulong)((long)expr_ptr[0xc].
                                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                             - (long)expr_ptr[0xb].
                                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                     .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                     _M_head_impl >> 3)) goto LAB_0059f6af;
        chunk_index = Binder::GenerateTableIndex
                                (*(Binder **)
                                  ((local_198->super_Expression).super_BaseExpression.alias.
                                   _M_dataplus._M_p + 8));
        make_uniq<duckdb::LogicalColumnDataGet,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
                  ((duckdb *)&local_160,&chunk_index,&types,&collection);
        cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 7;
        make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType>
                  ((duckdb *)&local_1a8,(JoinType *)&cond);
        iVar7 = chunk_index;
        pLVar16 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a8);
        (pLVar16->super_LogicalJoin).mark_index = iVar7;
        pLVar16 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a8);
        local_168._M_head_impl =
             (LogicalOperator *)
             (local_198->super_Expression).super_BaseExpression.alias.field_2._M_allocated_capacity;
        (local_198->super_Expression).super_BaseExpression.alias.field_2._M_allocated_capacity = 0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar16,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_168);
        if (local_168._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_168._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_168._M_head_impl = (LogicalOperator *)0x0;
        pLVar16 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a8);
        local_170._M_head_impl = local_160;
        local_160 = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar16,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_170);
        if (local_170._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_170._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_170._M_head_impl = (LogicalOperator *)0x0;
        cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        cond.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(this_00,0);
        _Var2._M_head_impl =
             (pvVar11->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if (cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          lVar22 = *(long *)cond.left.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               _Var2._M_head_impl;
          (**(code **)(lVar22 + 8))();
          _Var2._M_head_impl =
               (Expression *)
               cond.left.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        }
        cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             _Var2._M_head_impl;
        child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)chunk_index;
        child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                  ((duckdb *)&local_1b0,&in_type,(ColumnBinding *)&child_bindings);
        uVar8 = cond.right;
        cond.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             local_1b0._M_head_impl;
        local_1b0._M_head_impl = (Expression *)0x0;
        if ((uVar8.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0) &&
           ((**(code **)(*(long *)uVar8.
                                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                        8))(), local_1b0._M_head_impl != (Expression *)0x0)) {
          (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        cond.comparison = COMPARE_BOUNDARY_START;
        pLVar16 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_1a8);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  (&(pLVar16->conditions).
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                   &cond);
        _Var5._M_head_impl = local_1a8._M_head_impl;
        local_1a8._M_head_impl = (LogicalComparisonJoin *)0x0;
        this_01 = &(local_198->super_Expression).super_BaseExpression.alias.field_2;
        plVar3 = (long *)this_01->_M_allocated_capacity;
        this_01->_M_allocated_capacity = (size_type)_Var5._M_head_impl;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        this_02 = &(local_198->super_Expression).super_BaseExpression.alias._M_string_length;
        pLVar17 = optional_ptr<duckdb::LogicalOperator,_true>::operator->
                            ((optional_ptr<duckdb::LogicalOperator,_true> *)this_02);
        if (pLVar17->type == LOGICAL_FILTER) {
          pLVar17 = optional_ptr<duckdb::LogicalOperator,_true>::operator->
                              ((optional_ptr<duckdb::LogicalOperator,_true> *)this_02);
          pLVar18 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar17);
          if ((pLVar18->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (pLVar18->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pLVar19 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                    *)&this_01->_M_allocated_capacity);
            (*pLVar19->_vptr_LogicalOperator[2])(&child_bindings);
            for (local_1b0._M_head_impl = (Expression *)0x0;
                local_1b0._M_head_impl <
                (Expression *)
                ((long)child_bindings.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)child_bindings.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
                local_1b0._M_head_impl =
                     (Expression *)
                     ((long)&((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression +
                     1)) {
              pvVar20 = vector<duckdb::ColumnBinding,_true>::get<true>
                                  (&child_bindings,(size_type)local_1b0._M_head_impl);
              if (pvVar20->table_index != chunk_index) {
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &pLVar18->projection_map,(value_type_conflict2 *)&local_1b0);
              }
            }
            ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
            ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                           *)&child_bindings);
          }
        }
        child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)chunk_index;
        child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[9],duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
                  ((duckdb *)&local_1b0,(char (*) [9])"IN (...)",&LogicalType::BOOLEAN,
                   (ColumnBinding *)&child_bindings);
        ((local_1a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
             (_func_int **)local_1b0._M_head_impl;
        if (cVar1 != '#') {
          local_1b0._M_head_impl._0_1_ = 0xd;
          make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
                    ((duckdb *)&child_bindings,(ExpressionType *)&local_1b0,&LogicalType::BOOLEAN);
          _Var2._M_head_impl = local_1a0._M_head_impl;
          pBVar21 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                                  *)&child_bindings);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar21->children,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)_Var2._M_head_impl);
          pCVar6 = child_bindings.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
          .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          pp_Var4 = ((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression;
          ((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)pCVar6;
          if ((pp_Var4 != (_func_int **)0x0) &&
             ((**(code **)(*pp_Var4 + 8))(),
             child_bindings.
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            (**(code **)((child_bindings.
                          super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          .
                          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start)->table_index + 8))();
          }
        }
        JoinCondition::~JoinCondition(&cond);
        if (local_1a8._M_head_impl != (LogicalComparisonJoin *)0x0) {
          (*((local_1a8._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
            _vptr_LogicalOperator[1])();
        }
        if (local_160 != (LogicalOperator *)0x0) {
          (*local_160->_vptr_LogicalOperator[1])();
        }
LAB_0059fbe0:
        DataChunk::~DataChunk(&chunk);
        ColumnDataAppendState::~ColumnDataAppendState(&append_state);
        ::std::
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::~unique_ptr(&collection.
                       super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                     );
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        goto LAB_0059fc0e;
      }
      chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(CONCAT71(chunk.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,cVar1 == '#') | 0x32);
      make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
                ((duckdb *)&append_state,(ExpressionType *)&chunk);
      for (uVar23 = 1;
          uVar23 < (ulong)((long)expr_ptr[0xc].
                                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
                           (long)expr_ptr[0xb].
                                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >>
                          3); uVar23 = uVar23 + 1) {
        pBVar15 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                                *)&append_state);
        child_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(child_bindings.
                               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               .
                               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               '\x1a' - (cVar1 == '#'));
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(this_00,0);
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar11);
        (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&types,pEVar12);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(this_00,uVar23);
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&cond,(ExpressionType *)&child_bindings,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &types,pvVar11);
        chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)cond.left;
        cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar15->children,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &chunk);
        if (chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*(long *)chunk.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)cond.left.
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8
                      ))();
        }
        cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        if (types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*(long *)types.
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    ((local_1a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
         (_func_int **)append_state.current_chunk_state.handles._M_h._M_buckets;
LAB_0059fc0e:
    LogicalType::~LogicalType(&in_type);
  }
  else {
    (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_1a0._M_head_impl;
LAB_0059f6af:
  LogicalType::LogicalType(&local_48,SQLNULL);
  Value::Value((Value *)&cond,&local_48);
  LogicalType::~LogicalType(&local_48);
  context = *(ClientContext **)&(local_198->super_Expression).super_BaseExpression.type;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(this_00,uVar23);
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (pvVar11);
  bVar9 = ExpressionExecutor::TryEvaluateScalar(context,expr_00,(Value *)&cond);
  iVar7 = chunk.count;
  if (bVar9) {
    chunk.count = chunk.count + 1;
    DataChunk::SetValue(&chunk,0,iVar7,(Value *)&cond);
    if ((chunk.count == 0x800) ||
       (uVar23 + 1 ==
        (long)expr_ptr[0xc].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
        (long)expr_ptr[0xb].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3)) {
      pCVar14 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator->(&collection);
      ColumnDataCollection::Append(pCVar14,&append_state,&chunk);
      DataChunk::Reset(&chunk);
    }
  }
  else {
    ((local_1a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  }
  Value::~Value((Value *)&cond);
  uVar23 = uVar23 + 1;
  if (!bVar9) goto LAB_0059fbe0;
  goto LAB_0059f698;
}

Assistant:

unique_ptr<Expression> InClauseRewriter::VisitReplace(BoundOperatorExpression &expr, unique_ptr<Expression> *expr_ptr) {
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN &&
	    expr.GetExpressionType() != ExpressionType::COMPARE_NOT_IN) {
		return nullptr;
	}
	D_ASSERT(root);
	auto in_type = expr.children[0]->return_type;
	bool is_regular_in = expr.GetExpressionType() == ExpressionType::COMPARE_IN;
	bool all_scalar = true;
	// IN clause with many children: try to generate a mark join that replaces this IN expression
	// we can only do this if the expressions in the expression list are scalar
	for (idx_t i = 1; i < expr.children.size(); i++) {
		if (!expr.children[i]->IsFoldable()) {
			// non-scalar expression
			all_scalar = false;
		}
	}
	if (expr.children.size() == 2) {
		// only one child
		// IN: turn into X = 1
		// NOT IN: turn into X <> 1
		return make_uniq<BoundComparisonExpression>(is_regular_in ? ExpressionType::COMPARE_EQUAL
		                                                          : ExpressionType::COMPARE_NOTEQUAL,
		                                            std::move(expr.children[0]), std::move(expr.children[1]));
	}
	if (expr.children.size() < 6 || !all_scalar) {
		// low amount of children or not all scalar
		// IN: turn into (X = 1 OR X = 2 OR X = 3...)
		// NOT IN: turn into (X <> 1 AND X <> 2 AND X <> 3 ...)
		auto conjunction = make_uniq<BoundConjunctionExpression>(is_regular_in ? ExpressionType::CONJUNCTION_OR
		                                                                       : ExpressionType::CONJUNCTION_AND);
		for (idx_t i = 1; i < expr.children.size(); i++) {
			conjunction->children.push_back(make_uniq<BoundComparisonExpression>(
			    is_regular_in ? ExpressionType::COMPARE_EQUAL : ExpressionType::COMPARE_NOTEQUAL,
			    expr.children[0]->Copy(), std::move(expr.children[i])));
		}
		return std::move(conjunction);
	}
	// IN clause with many constant children
	// generate a mark join that replaces this IN expression
	// first generate a ColumnDataCollection from the set of expressions
	vector<LogicalType> types = {in_type};
	auto collection = make_uniq<ColumnDataCollection>(context, types);
	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);

	DataChunk chunk;
	chunk.Initialize(context, types);
	for (idx_t i = 1; i < expr.children.size(); i++) {
		// resolve this expression to a constant
		Value value;
		if (!ExpressionExecutor::TryEvaluateScalar(context, *expr.children[i], value)) {
			// error while evaluating scalar
			return nullptr;
		}
		idx_t index = chunk.size();
		chunk.SetCardinality(chunk.size() + 1);
		chunk.SetValue(0, index, value);
		if (chunk.size() == STANDARD_VECTOR_SIZE || i + 1 == expr.children.size()) {
			// chunk full: append to chunk collection
			collection->Append(append_state, chunk);
			chunk.Reset();
		}
	}
	// now generate a ChunkGet that scans this collection
	auto chunk_index = optimizer.binder.GenerateTableIndex();
	auto chunk_scan = make_uniq<LogicalColumnDataGet>(chunk_index, types, std::move(collection));

	// then we generate the MARK join with the chunk scan on the RHS
	auto join = make_uniq<LogicalComparisonJoin>(JoinType::MARK);
	join->mark_index = chunk_index;
	join->AddChild(std::move(root));
	join->AddChild(std::move(chunk_scan));
	// create the JOIN condition
	JoinCondition cond;
	cond.left = std::move(expr.children[0]);

	cond.right = make_uniq<BoundColumnRefExpression>(in_type, ColumnBinding(chunk_index, 0));
	cond.comparison = ExpressionType::COMPARE_EQUAL;
	join->conditions.push_back(std::move(cond));
	root = std::move(join);

	if (current_op->type == LogicalOperatorType::LOGICAL_FILTER) {
		// project out the mark index again
		auto &filter = current_op->Cast<LogicalFilter>();
		if (filter.projection_map.empty()) {
			auto child_bindings = root->GetColumnBindings();
			for (idx_t i = 0; i < child_bindings.size(); i++) {
				if (child_bindings[i].table_index != chunk_index) {
					filter.projection_map.push_back(i);
				}
			}
		}
	}

	// we replace the original subquery with a BoundColumnRefExpression referring to the mark column
	unique_ptr<Expression> result =
	    make_uniq<BoundColumnRefExpression>("IN (...)", LogicalType::BOOLEAN, ColumnBinding(chunk_index, 0));
	if (!is_regular_in) {
		// NOT IN: invert
		auto invert = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_NOT, LogicalType::BOOLEAN);
		invert->children.push_back(std::move(result));
		result = std::move(invert);
	}
	return result;
}